

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcodes.c
# Opt level: O3

void push_to_stack(em8051 *aCPU,int aValue)

{
  byte bVar1;
  ulong uVar2;
  uchar *puVar3;
  
  aCPU->mSFR[1] = aCPU->mSFR[1] + '\x01';
  bVar1 = aCPU->mSFR[1];
  uVar2 = (ulong)bVar1;
  if ((char)bVar1 < '\0') {
    puVar3 = aCPU->mUpperData;
    if (puVar3 == (uchar *)0x0) {
      if (aCPU->except != (em8051exception)0x0) {
        (*aCPU->except)(aCPU,0);
      }
      goto LAB_001068b9;
    }
    uVar2 = (ulong)(bVar1 & 0x7f);
  }
  else {
    puVar3 = aCPU->mLowerData;
  }
  puVar3[uVar2] = (uchar)aValue;
LAB_001068b9:
  if ((aCPU->mSFR[1] == '\0') && (aCPU->except != (em8051exception)0x0)) {
    (*aCPU->except)(aCPU,0);
    return;
  }
  return;
}

Assistant:

void push_to_stack(struct em8051 *aCPU, int aValue)
{
    aCPU->mSFR[REG_SP]++;
    if (aCPU->mSFR[REG_SP] > 0x7f)
    {
        if (aCPU->mUpperData)
        {
            aCPU->mUpperData[aCPU->mSFR[REG_SP] - 0x80] = aValue;
        }
        else
        {
            if (aCPU->except)
                aCPU->except(aCPU, EXCEPTION_STACK);
        }
    }
    else
    {
        aCPU->mLowerData[aCPU->mSFR[REG_SP]] = aValue;
    }
    if (aCPU->mSFR[REG_SP] == 0)
        if (aCPU->except)
            aCPU->except(aCPU, EXCEPTION_STACK);
}